

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::UBOBindingRenderCase::~UBOBindingRenderCase
          (UBOBindingRenderCase *this)

{
  ~UBOBindingRenderCase(this);
  operator_delete(this,0x118);
  return;
}

Assistant:

UBOBindingRenderCase::~UBOBindingRenderCase (void)
{
	deinit();
}